

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O0

void luaT_adjustvarargs(lua_State *L,int nfixparams,CallInfo *ci,Proto *p)

{
  StkId pSVar1;
  StkId pSVar2;
  int iVar3;
  TValue *io2_1;
  TValue *io1_1;
  TValue *io2;
  TValue *io1;
  int nextra;
  int actual;
  int i;
  Proto *p_local;
  CallInfo *ci_local;
  int nfixparams_local;
  lua_State *L_local;
  
  iVar3 = (int)((long)(L->top).p - (ci->func).offset >> 4);
  (ci->u).l.nextraargs = (iVar3 + -1) - nfixparams;
  if ((long)(L->stack_last).p - (L->top).offset >> 4 <= (long)(int)(p->maxstacksize + 1)) {
    luaD_growstack(L,p->maxstacksize + 1,1);
  }
  pSVar1 = (L->top).p;
  (L->top).p = pSVar1 + 1;
  pSVar2 = (ci->func).p;
  (pSVar1->val).value_ = (pSVar2->val).value_;
  (pSVar1->val).tt_ = *(lu_byte *)((long)pSVar2 + 8);
  for (nextra = 1; nextra <= nfixparams; nextra = nextra + 1) {
    pSVar1 = (L->top).p;
    (L->top).p = pSVar1 + 1;
    pSVar2 = (ci->func).p;
    (pSVar1->val).value_ = pSVar2[nextra].val.value_;
    (pSVar1->val).tt_ = *(lu_byte *)((long)(pSVar2 + nextra) + 8);
    (&((ci->func).p)->val)[nextra].tt_ = '\0';
  }
  (ci->func).p = (ci->func).p + iVar3;
  (ci->top).p = (ci->top).p + iVar3;
  return;
}

Assistant:

void luaT_adjustvarargs (lua_State *L, int nfixparams, CallInfo *ci,
                         const Proto *p) {
  int i;
  int actual = cast_int(L->top.p - ci->func.p) - 1;  /* number of arguments */
  int nextra = actual - nfixparams;  /* number of extra arguments */
  ci->u.l.nextraargs = nextra;
  luaD_checkstack(L, p->maxstacksize + 1);
  /* copy function to the top of the stack */
  setobjs2s(L, L->top.p++, ci->func.p);
  /* move fixed parameters to the top of the stack */
  for (i = 1; i <= nfixparams; i++) {
    setobjs2s(L, L->top.p++, ci->func.p + i);
    setnilvalue(s2v(ci->func.p + i));  /* erase original parameter (for GC) */
  }
  ci->func.p += actual + 1;
  ci->top.p += actual + 1;
  lua_assert(L->top.p <= ci->top.p && ci->top.p <= L->stack_last.p);
}